

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O1

ze_result_t
tracing_layer::zeModuleInspectLinkageExt
          (ze_linkage_inspection_ext_desc_t *pInspectDesc,uint32_t numModules,
          ze_module_handle_t *phModules,ze_module_build_log_handle_t *phLog)

{
  _func_void__ze_module_inspect_linkage_ext_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr *p_Var1;
  _func__ze_result_t__ze_linkage_inspection_ext_desc_t_ptr_uint__ze_module_handle_t_ptr_ptr__ze_module_build_log_handle_t_ptr_ptr
  *zeApiPtr;
  _ze_result_t _Var2;
  ze_result_t zVar3;
  char *pcVar4;
  ulong *puVar5;
  _ze_module_build_log_handle_t **in_RCX;
  _ze_module_handle_t **in_RDX;
  long lVar6;
  uint in_ESI;
  _ze_linkage_inspection_ext_desc_t *in_RDI;
  ulong uVar7;
  APITracerCallbackDataImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
  apiCallbackData;
  APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
  epilogCallback;
  APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
  prologCallback;
  ze_module_inspect_linkage_ext_params_t tracerParams;
  uint local_f4;
  _ze_module_build_log_handle_t **local_f0;
  _ze_module_handle_t **local_e8;
  _ze_linkage_inspection_ext_desc_t *local_e0;
  _func_void__ze_module_inspect_linkage_ext_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
  *local_d8;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  vStack_d0;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_b8;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_a0;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_88;
  APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
  local_70;
  APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
  local_60;
  _ze_module_inspect_linkage_ext_params_t local_50;
  
  if (DAT_0017f668 ==
      (_func__ze_result_t__ze_linkage_inspection_ext_desc_t_ptr_uint__ze_module_handle_t_ptr_ptr__ze_module_build_log_handle_t_ptr_ptr
       *)0x0) {
    zVar3 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    local_f4 = in_ESI;
    local_f0 = in_RCX;
    local_e8 = in_RDX;
    local_e0 = in_RDI;
    tracing_layer::tracingInProgress::__tls_init();
    pcVar4 = (char *)__tls_get_addr(&PTR_0017efa0);
    if (*pcVar4 != '\0') {
      _Var2 = (*DAT_0017f668)(local_e0,local_f4,local_e8,local_f0);
      return _Var2;
    }
    tracing_layer::tracingInProgress::__tls_init();
    *pcVar4 = '\x01';
    local_50.ppInspectDesc = &local_e0;
    local_50.pnumModules = &local_f4;
    local_50.pphModules = &local_e8;
    local_50.pphLog = &local_f0;
    local_b8.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
          *)0x0;
    vStack_d0.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
          *)0x0;
    vStack_d0.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
          *)0x0;
    local_d8 = (_func_void__ze_module_inspect_linkage_ext_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                *)0x0;
    vStack_d0.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
          *)0x0;
    puVar5 = (ulong *)(**(code **)(*pGlobalAPITracerContextImp + 0x10))();
    if ((puVar5 != (ulong *)0x0) && (*puVar5 != 0)) {
      lVar6 = 0;
      uVar7 = 0;
      do {
        local_60.current_api_callback =
             *(_func_void__ze_module_inspect_linkage_ext_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
               **)(puVar5[1] + 0x5b0 + lVar6);
        p_Var1 = *(_func_void__ze_module_inspect_linkage_ext_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                   **)(puVar5[1] + 0xc08 + lVar6);
        local_60.pUserData = *(void **)(puVar5[1] + 0xcb0 + lVar6);
        if (vStack_d0.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            vStack_d0.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_module_inspect_linkage_ext_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_module_inspect_linkage_ext_params_t*,_ze_result_t,void*,void**)>>>
          ::
          _M_realloc_insert<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_module_inspect_linkage_ext_params_t*,_ze_result_t,void*,void**)>const&>
                    ((vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_module_inspect_linkage_ext_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_module_inspect_linkage_ext_params_t*,_ze_result_t,void*,void**)>>>
                      *)&vStack_d0,
                     (iterator)
                     vStack_d0.
                     super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_60);
        }
        else {
          (vStack_d0.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->current_api_callback =
               local_60.current_api_callback;
          (vStack_d0.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->pUserData = local_60.pUserData;
          vStack_d0.
          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               vStack_d0.
               super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        local_70.pUserData = *(void **)(puVar5[1] + 0xcb0 + lVar6);
        local_70.current_api_callback = p_Var1;
        if (local_b8.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_b8.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_module_inspect_linkage_ext_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_module_inspect_linkage_ext_params_t*,_ze_result_t,void*,void**)>>>
          ::
          _M_realloc_insert<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_module_inspect_linkage_ext_params_t*,_ze_result_t,void*,void**)>const&>
                    ((vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_module_inspect_linkage_ext_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_module_inspect_linkage_ext_params_t*,_ze_result_t,void*,void**)>>>
                      *)&local_b8,
                     (iterator)
                     local_b8.
                     super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_70);
        }
        else {
          (local_b8.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->current_api_callback = p_Var1;
          (local_b8.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->pUserData = local_70.pUserData;
          local_b8.
          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_b8.
               super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        uVar7 = uVar7 + 1;
        lVar6 = lVar6 + 0xcb8;
      } while (uVar7 < *puVar5);
    }
    p_Var1 = local_d8;
    zeApiPtr = DAT_0017f668;
    std::
    vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::vector(&local_88,&vStack_d0);
    std::
    vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::vector(&local_a0,&local_b8);
    zVar3 = APITracerWrapperImp<_ze_result_t(*)(_ze_linkage_inspection_ext_desc_t*,unsigned_int,_ze_module_handle_t**,_ze_module_build_log_handle_t**),_ze_module_inspect_linkage_ext_params_t*,void(*)(_ze_module_inspect_linkage_ext_params_t*,_ze_result_t,void*,void**),std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_module_inspect_linkage_ext_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_module_inspect_linkage_ext_params_t*,_ze_result_t,void*,void**)>>>,std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_module_inspect_linkage_ext_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_module_inspect_linkage_ext_params_t*,_ze_result_t,void*,void**)>>>,_ze_linkage_inspection_ext_desc_t*&,unsigned_int&,_ze_module_handle_t**&,_ze_module_build_log_handle_t**&>
                      (zeApiPtr,&local_50,p_Var1,&local_88,&local_a0,local_50.ppInspectDesc,
                       local_50.pnumModules,local_50.pphModules,local_50.pphLog);
    if (local_a0.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_a0.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a0.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_88.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_b8.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_b8.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (vStack_d0.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vStack_d0.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)vStack_d0.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vStack_d0.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_module_inspect_linkage_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return zVar3;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeModuleInspectLinkageExt(
        ze_linkage_inspection_ext_desc_t* pInspectDesc, ///< [in] pointer to linkage inspection descriptor structure.
        uint32_t numModules,                            ///< [in] number of modules to be inspected pointed to by phModules.
        ze_module_handle_t* phModules,                  ///< [in][range(0, numModules)] pointer to an array of modules to be
                                                        ///< inspected for import dependencies.
        ze_module_build_log_handle_t* phLog             ///< [out] pointer to handle of linkage inspection log. Log object will
                                                        ///< contain separate lists of imports, un-resolvable imports, and exports.
        )
    {
        auto pfnInspectLinkageExt = context.zeDdiTable.Module.pfnInspectLinkageExt;

        if( nullptr == pfnInspectLinkageExt)
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;

        ZE_HANDLE_TRACER_RECURSION(context.zeDdiTable.Module.pfnInspectLinkageExt, pInspectDesc, numModules, phModules, phLog);

        // capture parameters
        ze_module_inspect_linkage_ext_params_t tracerParams = {
            &pInspectDesc,
            &numModules,
            &phModules,
            &phLog
        };

        tracing_layer::APITracerCallbackDataImp<ze_pfnModuleInspectLinkageExtCb_t> apiCallbackData;

        ZE_GEN_PER_API_CALLBACK_STATE(apiCallbackData, ze_pfnModuleInspectLinkageExtCb_t, Module, pfnInspectLinkageExtCb);


        return tracing_layer::APITracerWrapperImp(context.zeDdiTable.Module.pfnInspectLinkageExt,
                                                  &tracerParams,
                                                  apiCallbackData.apiOrdinal,
                                                  apiCallbackData.prologCallbacks,
                                                  apiCallbackData.epilogCallbacks,
                                                  *tracerParams.ppInspectDesc,
                                                  *tracerParams.pnumModules,
                                                  *tracerParams.pphModules,
                                                  *tracerParams.pphLog);
    }